

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall
SceneRender::setShaders
          (SceneRender *this,Uniforms *_uniforms,string *_fragmentShader,string *_vertexShader)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  pointer ppVar6;
  Vbo *pVVar7;
  Shader *pSVar8;
  size_type sVar9;
  size_type sVar10;
  Model *pMVar11;
  reference ppMVar12;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  DefaultShaders _type_04;
  DefaultShaders _type_05;
  DefaultShaders _type_06;
  DefaultShaders _type_07;
  DefaultShaders _type_08;
  DefaultShaders _type_09;
  undefined1 auVar13 [16];
  bool local_a81;
  string local_9d8;
  int local_9b8;
  allocator local_9b1;
  int i_5;
  allocator local_989;
  string local_988 [32];
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  string local_928;
  undefined1 local_901;
  Mesh local_900;
  string local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  Model *local_818;
  int local_810;
  int local_80c;
  int i_4;
  int devLookBillboards;
  int local_7e8;
  allocator local_7e1;
  int i_3;
  allocator local_7b9;
  string local_7b8 [32];
  string local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758;
  undefined1 local_731;
  Mesh local_730;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  Model *local_648;
  int local_63c;
  int local_638;
  int i_2;
  int devLookSpheres;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  string local_580;
  string local_560;
  undefined1 local_540 [8];
  string bufferName_1;
  size_t i_1;
  allocator local_4f1;
  string local_4f0;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  string local_488;
  allocator local_461;
  string local_460;
  Mesh local_440;
  allocator local_391;
  string local_390;
  bool local_36a;
  allocator local_369;
  string local_368 [6];
  bool thereIsFloorDefine;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator local_301;
  string local_300 [32];
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  string bufferName;
  size_t i;
  allocator local_251;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  _Self local_1a0;
  _Self local_198;
  iterator it;
  int local_184;
  undefined1 local_180 [2];
  bool normal_buffer;
  bool position_buffer;
  int local_15c;
  string local_158;
  int local_134;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  string *local_28;
  string *_vertexShader_local;
  string *_fragmentShader_local;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  local_28 = _vertexShader;
  _vertexShader_local = _fragmentShader;
  _fragmentShader_local = (string *)_uniforms;
  _uniforms_local = (Uniforms *)this;
  bVar2 = checkBackground(_fragmentShader);
  this->m_background = bVar2;
  if ((this->m_background & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"BACKGROUND",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"",&local_81);
    vera::HaveDefines::addDefine(&(this->m_background_shader).super_HaveDefines,&local_48,&local_80)
    ;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    psVar1 = _vertexShader_local;
    vera::getDefaultSrc_abi_cxx11_(&local_a8,(vera *)0x5,_type);
    vera::Shader::setSource(&this->m_background_shader,psVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"GLSLVIEWER",&local_c9);
    local_134 = 3;
    vera::toString<int>(&local_130,&local_134);
    local_15c = 3;
    vera::toString<int>(&local_158,&local_15c);
    std::operator+(&local_110,&local_130,&local_158);
    local_184 = 0;
    vera::toString<int>((string *)local_180,&local_184);
    std::operator+(&local_f0,&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
    vera::HaveDefines::addDefine(&(this->m_background_shader).super_HaveDefines,&local_c8,&local_f0)
    ;
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  bVar2 = findId(_vertexShader_local,"u_scenePosition;");
  bVar3 = findId(_vertexShader_local,"u_sceneNormal;");
  bVar4 = findId(_vertexShader_local,"u_lightShadowMap;");
  this->m_shadows = bVar4;
  it._M_node._4_4_ = countSceneBuffers(local_28);
  it._M_node._0_4_ = countSceneBuffers(_vertexShader_local);
  piVar5 = std::max<int>((int *)((long)&it._M_node + 4),(int *)&it);
  this->m_buffers_total = (long)*piVar5;
  local_198._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                *)&_fragmentShader_local[9]._M_string_length);
  while( true ) {
    local_1a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                *)&_fragmentShader_local[9]._M_string_length);
    bVar4 = std::operator!=(&local_198,&local_1a0);
    if (!bVar4) break;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_198);
    vera::Model::setShader(ppVar6->second,_vertexShader_local,local_28);
    if ((this->m_shadows & 1U) != 0) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pMVar11 = ppVar6->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"shadow",&local_1c1);
      vera::getDefaultSrc_abi_cxx11_(&local_1e8,(vera *)0xb,_type_00);
      vera::Model::setBufferShader(pMVar11,&local_1c0,&local_1e8,local_28);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    if (bVar2) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pMVar11 = ppVar6->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,"position",&local_209);
      vera::getDefaultSrc_abi_cxx11_(&local_230,(vera *)0x12,_type_01);
      vera::Model::setBufferShader(pMVar11,&local_208,&local_230,local_28);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
    }
    if (bVar3) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pMVar11 = ppVar6->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"normal",&local_251);
      vera::getDefaultSrc_abi_cxx11_((string *)&i,(vera *)0x13,_type_02);
      vera::Model::setBufferShader(pMVar11,&local_250,(string *)&i,local_28);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
    }
    for (bufferName.field_2._8_8_ = 0; (ulong)bufferName.field_2._8_8_ < this->m_buffers_total;
        bufferName.field_2._8_8_ = bufferName.field_2._8_8_ + 1) {
      vera::toString<unsigned_long>
                (&local_2c0,(unsigned_long *)(bufferName.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     "u_sceneBuffer",&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pMVar11 = ppVar6->second;
      std::__cxx11::string::string((string *)&local_2e0,(string *)local_2a0);
      vera::Model::setBufferShader(pMVar11,&local_2e0,_vertexShader_local,local_28);
      std::__cxx11::string::~string((string *)&local_2e0);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pSVar8 = vera::Model::getBufferShader(ppVar6->second,(string *)local_2a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"FLOOR",&local_301);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[0xb])(pSVar8,local_300);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_198);
      pSVar8 = vera::Model::getBufferShader(ppVar6->second,(string *)local_2a0);
      vera::toString<unsigned_long>
                (&local_348,(unsigned_long *)(bufferName.field_2._M_local_buf + 8));
      std::operator+(&local_328,"SCENE_BUFFER_",&local_348);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"",&local_369);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[10])(pSVar8,&local_328,local_368);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)local_2a0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
    ::operator++(&local_198);
  }
  bVar4 = checkFloor(_vertexShader_local);
  local_a81 = true;
  if (!bVar4) {
    local_a81 = checkFloor(local_28);
  }
  local_36a = local_a81;
  if (local_a81 != false) {
    pVVar7 = vera::Model::getVbo(&this->m_floor);
    if (pVVar7 == (Vbo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"FLOOR",&local_391);
      vera::Model::setName(&this->m_floor,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      vera::planeMesh(&local_440,1.0,1.0,2,2,TRIANGLES);
      vera::Model::setGeom(&this->m_floor,&local_440);
      vera::Mesh::~Mesh(&local_440);
    }
    vera::Model::setShader(&this->m_floor,_vertexShader_local,local_28);
    if (this->m_floor_subd == -1) {
      this->m_floor_subd_target = 0;
    }
    if ((this->m_shadows & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_460,"shadow",&local_461);
      vera::getDefaultSrc_abi_cxx11_(&local_488,(vera *)0xb,_type_03);
      vera::Model::setBufferShader(&this->m_floor,&local_460,&local_488,local_28);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
    }
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4a8,"position",&local_4a9);
      vera::getDefaultSrc_abi_cxx11_(&local_4d0,(vera *)0x12,_type_04);
      vera::Model::setBufferShader(&this->m_floor,&local_4a8,&local_4d0,local_28);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    }
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4f0,"normal",&local_4f1);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_1,(vera *)0x13,_type_05);
      vera::Model::setBufferShader(&this->m_floor,&local_4f0,(string *)&i_1,local_28);
      std::__cxx11::string::~string((string *)&i_1);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    }
    for (bufferName_1.field_2._8_8_ = 0; (ulong)bufferName_1.field_2._8_8_ < this->m_buffers_total;
        bufferName_1.field_2._8_8_ = bufferName_1.field_2._8_8_ + 1) {
      vera::toString<unsigned_long>
                (&local_560,(unsigned_long *)(bufferName_1.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                     "u_sceneBuffer",&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::string((string *)&local_580,(string *)local_540);
      vera::Model::setBufferShader(&this->m_floor,&local_580,_vertexShader_local,local_28);
      std::__cxx11::string::~string((string *)&local_580);
      pSVar8 = vera::Model::getBufferShader(&this->m_floor,(string *)local_540);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a0,"FLOOR",&local_5a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,"",&local_5c9);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[10])(pSVar8,local_5a0,local_5c8);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
      std::__cxx11::string::~string(local_5a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
      pSVar8 = vera::Model::getBufferShader(&this->m_floor,(string *)local_540);
      vera::toString<unsigned_long>
                (&local_610,(unsigned_long *)(bufferName_1.field_2._M_local_buf + 8));
      std::operator+(&local_5f0,"SCENE_BUFFER_",&local_610);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&devLookSpheres,"",(allocator *)((long)&i_2 + 3));
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[10])(pSVar8,&local_5f0,&devLookSpheres);
      std::__cxx11::string::~string((string *)&devLookSpheres);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)local_540);
    }
  }
  local_638 = countDevLookSpheres(_vertexShader_local);
  sVar9 = (size_type)local_638;
  sVar10 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                     (&this->m_devlook_spheres);
  if (sVar9 == sVar10) {
    if (0 < local_638) {
      for (local_7e8 = 0; local_7e8 < local_638; local_7e8 = local_7e8 + 1) {
        ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                             (&this->m_devlook_spheres,(long)local_7e8);
        psVar1 = _vertexShader_local;
        pMVar11 = *ppMVar12;
        vera::getDefaultSrc_abi_cxx11_((string *)&i_4,(vera *)0x19,_type_07);
        vera::Model::setShader(pMVar11,psVar1,(string *)&i_4);
        std::__cxx11::string::~string((string *)&i_4);
      }
    }
  }
  else {
    std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::clear(&this->m_devlook_spheres);
    for (local_63c = 0; local_63c < local_638; local_63c = local_63c + 1) {
      pMVar11 = (Model *)operator_new(0x2d8);
      local_731 = 1;
      vera::toString<int>(&local_688,&local_63c);
      std::operator+(&local_668,"DEVLOOK_SPHERE_",&local_688);
      vera::sphereMesh(&local_730,0x18,1.0,TRIANGLES);
      vera::Model::Model(pMVar11,&local_668,&local_730);
      local_731 = 0;
      local_648 = pMVar11;
      std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::push_back
                (&this->m_devlook_spheres,&local_648);
      vera::Mesh::~Mesh(&local_730);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_688);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_spheres,(long)local_63c);
      psVar1 = _vertexShader_local;
      pMVar11 = *ppMVar12;
      vera::getDefaultSrc_abi_cxx11_(&local_758,(vera *)0x19,_type_06);
      vera::Model::setShader(pMVar11,psVar1,&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_spheres,(long)local_63c);
      pSVar8 = vera::Model::getShader(*ppMVar12);
      vera::toString<int>(&local_798,&local_63c);
      std::operator+(&local_778,"DEVLOOK_SPHERE_",&local_798);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b8,"",&local_7b9);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[10])(pSVar8,&local_778,local_7b8);
      std::__cxx11::string::~string(local_7b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_spheres,(long)local_63c);
      pSVar8 = vera::Model::getShader(*ppMVar12);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_3,"DEVLOOK_Y_OFFSET",&local_7e1);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[4])
                ((double)local_63c * -0.35 + 0.8,pSVar8,&i_3);
      std::__cxx11::string::~string((string *)&i_3);
      std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
    }
  }
  local_80c = countDevLookBillboards(_vertexShader_local);
  sVar9 = (size_type)local_80c;
  sVar10 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                     (&this->m_devlook_billboards);
  if (sVar9 == sVar10) {
    if (0 < local_80c) {
      for (local_9b8 = 0; local_9b8 < local_80c; local_9b8 = local_9b8 + 1) {
        ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                             (&this->m_devlook_billboards,(long)local_9b8);
        psVar1 = _vertexShader_local;
        pMVar11 = *ppMVar12;
        vera::getDefaultSrc_abi_cxx11_(&local_9d8,(vera *)0x18,_type_09);
        vera::Model::setShader(pMVar11,psVar1,&local_9d8);
        std::__cxx11::string::~string((string *)&local_9d8);
      }
    }
  }
  else {
    std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::clear(&this->m_devlook_billboards);
    for (local_810 = 0; local_810 < local_80c; local_810 = local_810 + 1) {
      pMVar11 = (Model *)operator_new(0x2d8);
      local_901 = 1;
      vera::toString<int>(&local_858,&local_810);
      std::operator+(&local_838,"DEVLOOK_BILLBOARD_",&local_858);
      vera::planeMesh(&local_900,1.0,1.0,2,2,TRIANGLES);
      vera::Model::Model(pMVar11,&local_838,&local_900);
      local_901 = 0;
      local_818 = pMVar11;
      std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::push_back
                (&this->m_devlook_billboards,&local_818);
      vera::Mesh::~Mesh(&local_900);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_858);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_billboards,(long)local_810);
      psVar1 = _vertexShader_local;
      pMVar11 = *ppMVar12;
      vera::getDefaultSrc_abi_cxx11_(&local_928,(vera *)0x18,_type_08);
      vera::Model::setShader(pMVar11,psVar1,&local_928);
      std::__cxx11::string::~string((string *)&local_928);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_billboards,(long)local_810);
      pSVar8 = vera::Model::getShader(*ppMVar12);
      vera::toString<int>(&local_968,&local_810);
      std::operator+(&local_948,"DEVLOOK_BILLBOARD_",&local_968);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_988,"",&local_989);
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[10])(pSVar8,&local_948,local_988);
      std::__cxx11::string::~string(local_988);
      std::allocator<char>::~allocator((allocator<char> *)&local_989);
      std::__cxx11::string::~string((string *)&local_948);
      std::__cxx11::string::~string((string *)&local_968);
      ppMVar12 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                           (&this->m_devlook_billboards,(long)local_810);
      pSVar8 = vera::Model::getShader(*ppMVar12);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_5,"DEVLOOK_Y_OFFSET",&local_9b1);
      sVar9 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                        (&this->m_devlook_spheres);
      auVar13._8_4_ = (int)(sVar9 >> 0x20);
      auVar13._0_8_ = sVar9;
      auVar13._12_4_ = 0x45300000;
      (*(pSVar8->super_HaveDefines)._vptr_HaveDefines[4])
                (((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) * -0.35 + 0.8 +
                 (double)local_810 * -0.325,pSVar8,&i_5);
      std::__cxx11::string::~string((string *)&i_5);
      std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
    }
  }
  return;
}

Assistant:

void SceneRender::setShaders(Uniforms& _uniforms, const std::string& _fragmentShader, const std::string& _vertexShader) {
    // Background
    m_background = checkBackground(_fragmentShader);
    if (m_background) {
        // Specific defines for this buffer
        m_background_shader.addDefine("BACKGROUND");
        m_background_shader.setSource(_fragmentShader, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        m_background_shader.addDefine("GLSLVIEWER", vera::toString(GLSLVIEWER_VERSION_MAJOR) + vera::toString(GLSLVIEWER_VERSION_MINOR) + vera::toString(GLSLVIEWER_VERSION_PATCH) );
    }

    bool position_buffer = findId(_fragmentShader, "u_scenePosition;");
    bool normal_buffer = findId(_fragmentShader, "u_sceneNormal;");
    m_shadows = findId(_fragmentShader, "u_lightShadowMap;");
    m_buffers_total = std::max( countSceneBuffers(_vertexShader), 
                                countSceneBuffers(_fragmentShader) );

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        it->second->setShader( _fragmentShader, _vertexShader);

        if (m_shadows)
            it->second->setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            it->second->setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            it->second->setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            it->second->setBufferShader(bufferName, _fragmentShader, _vertexShader);
            it->second->getBufferShader(bufferName)->delDefine("FLOOR");
            it->second->getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // Floor
    bool thereIsFloorDefine = checkFloor(_fragmentShader) || checkFloor(_vertexShader);
    if (thereIsFloorDefine) {
        if (m_floor.getVbo() == nullptr) {
            m_floor.setName("FLOOR");
            m_floor.setGeom( vera::planeMesh(1.0f, 1.0f, 2, 2) );
        }

        m_floor.setShader(_fragmentShader, _vertexShader);

        if (m_floor_subd == -1)
            m_floor_subd_target = 0;

        if (m_shadows) 
            m_floor.setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            m_floor.setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            m_floor.setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            m_floor.setBufferShader(bufferName, _fragmentShader, _vertexShader);
            m_floor.getBufferShader(bufferName)->addDefine("FLOOR");
            m_floor.getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // DevLook
    int devLookSpheres = countDevLookSpheres(_fragmentShader);
    if (devLookSpheres != m_devlook_spheres.size()) {
        m_devlook_spheres.clear();

        for (int i = 0; i < devLookSpheres; i++) {
            m_devlook_spheres.push_back( new vera::Model("DEVLOOK_SPHERE_" + vera::toString(i), vera::sphereMesh(24)) );

            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_SPHERE_" + vera::toString(i));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - i * 0.35);
        }
    }
    else if (devLookSpheres > 0)
        for (int i = 0; i < devLookSpheres; i++)
            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));

    int devLookBillboards = countDevLookBillboards(_fragmentShader);
    if (devLookBillboards != m_devlook_billboards.size()) {
        m_devlook_billboards.clear();

        for (int i = 0; i < devLookBillboards; i++) {
            m_devlook_billboards.push_back( new vera::Model("DEVLOOK_BILLBOARD_" + vera::toString(i), vera::planeMesh(1.0f, 1.0f, 2, 2)) );

            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_BILLBOARD_" + vera::toString(i));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - m_devlook_spheres.size() * 0.35 - i * 0.325);
        }
    }
    else if (devLookBillboards > 0)
        for (int i = 0; i < devLookBillboards; i++)
            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));

}